

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrROR0x66(CPU *this)

{
  byte bVar1;
  uint16_t addr;
  Memory *this_00;
  byte bVar2;
  byte bVar3;
  byte value;
  
  addr = this->PC;
  this->PC = addr + 1;
  bVar2 = Memory::Read8(this->m,addr);
  this_00 = this->m;
  bVar3 = Memory::Read8(this_00,(ushort)bVar2);
  bVar1 = this->field_0x2e;
  value = bVar1 & 0x80 | bVar3 >> 1;
  this->field_0x2e = bVar1 >> 7 | bVar3 << 7 | bVar1 & 0x3e | (value == 0) << 6;
  Memory::Write8(this_00,(ushort)bVar2,value);
  return 5;
}

Assistant:

int CPU::instrROR0x66() {
	uint16_t address = zeropage_addr_j();
	m->Write8(address, ROR(m->Read8(address)));
	return 5;
}